

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

int __thiscall
Fl_PostScript_Graphics_Driver::alpha_mask
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int w,int h,int D,int LD)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  short val_1;
  int ii_1;
  short local_8c;
  short o3_1;
  short o2_1;
  short o1_1;
  short error_1;
  short val;
  int ii;
  short o3;
  short o2;
  short o1;
  short error;
  int jj;
  short *swap;
  short *next;
  short *current;
  short *errors2;
  short *errors1;
  int V_;
  int V0;
  int V255;
  int l;
  int k;
  int j;
  int i;
  int xx;
  int LD_local;
  int D_local;
  int h_local;
  int w_local;
  uchar *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  this->mask = (uchar *)0x0;
  if (D / 2 << 1 == D) {
    iVar6 = w * D + LD;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    for (l = 0; l < h; l = l + 1) {
      for (k = 0; k < w; k = k + 1) {
        if (data[D + -1 + l * iVar6 + D * k] == '\0') {
          bVar4 = true;
        }
        else if (data[D + -1 + l * iVar6 + D * k] == 0xff) {
          bVar5 = true;
        }
        else {
          bVar3 = true;
        }
      }
      if (bVar3) break;
    }
    if (bVar3) {
      puVar8 = (uchar *)operator_new__((long)(((w + 1) / 2) * h * 4));
      this->mask = puVar8;
      for (k = 0; k < ((w + 1) / 2) * h * 4; k = k + 1) {
        this->mask[k] = '\0';
      }
      this->mx = w << 2;
      this->my = h << 2;
      iVar7 = (w + 1) / 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(w * 4 + 2);
      uVar9 = SUB168(auVar1 * ZEXT816(2),0);
      if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pvVar10 = operator_new__(uVar9);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(w * 4 + 2);
      uVar9 = SUB168(auVar2 * ZEXT816(2),0);
      if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(uVar9);
      for (k = 0; k < w * 4 + 2; k = k + 1) {
        *(undefined2 *)((long)pvVar11 + (long)k * 2) = 0;
      }
      for (k = 0; k < w * 4 + 2; k = k + 1) {
        *(undefined2 *)((long)pvVar10 + (long)k * 2) = 0;
      }
      for (l = 0; l < h; l = l + 1) {
        for (V0 = 0; V0 < 4; V0 = V0 + 2) {
          *(undefined2 *)((long)pvVar10 + 2) = 0;
          for (k = 0; k < w; k = k + 1) {
            for (V255 = 0; V255 < 4; V255 = V255 + 1) {
              iVar12 = k * 4 + V255;
              ii._2_2_ = (ushort)data[l * iVar6 + D * k + D + -1] +
                         *(short *)((long)pvVar11 + (long)(iVar12 + 1) * 2);
              if (0x7f < ii._2_2_) {
                iVar13 = (l * 4 + V0) * iVar7 + iVar12 / 8;
                this->mask[iVar13] =
                     this->mask[iVar13] | (byte)(1 << ((byte)((long)iVar12 % 8) & 0x1f));
                ii._2_2_ = ii._2_2_ + -0xff;
              }
              if (ii._2_2_ < 1) {
                ii._0_2_ = (short)((ii._2_2_ * 3 + -8) / 0x10);
                *(short *)((long)pvVar10 + (long)iVar12 * 2) =
                     *(short *)((long)pvVar10 + (long)iVar12 * 2) + (short)ii;
                val = (short)((ii._2_2_ * 7 + -8) / 0x10);
                *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) =
                     *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) + val;
                error_1 = (short)((long)(ii._2_2_ + -8) / 0x10);
                *(short *)((long)pvVar10 + (long)(iVar12 + 2) * 2) = error_1;
              }
              else {
                ii._0_2_ = (short)((ii._2_2_ * 3 + 8) / 0x10);
                *(short *)((long)pvVar10 + (long)iVar12 * 2) =
                     *(short *)((long)pvVar10 + (long)iVar12 * 2) + (short)ii;
                val = (short)((ii._2_2_ * 7 + 8) / 0x10);
                *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) =
                     *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) + val;
                error_1 = (short)((long)(ii._2_2_ + 8) / 0x10);
                *(short *)((long)pvVar10 + (long)(iVar12 + 2) * 2) = error_1;
              }
              *(short *)((long)pvVar10 + (long)(iVar12 + 1) * 2) =
                   *(short *)((long)pvVar10 + (long)(iVar12 + 1) * 2) +
                   (((ii._2_2_ - (short)ii) - val) - error_1);
            }
          }
          *(undefined2 *)((long)pvVar11 + 2) = 0;
          for (k = w + -1; -1 < k; k = k + -1) {
            for (V255 = 3; -1 < V255; V255 = V255 + -1) {
              iVar12 = k * 4 + V255;
              local_8c = (ushort)data[l * iVar6 + D * k + D + -1] +
                         *(short *)((long)pvVar10 + (long)(iVar12 + 1) * 2);
              if (0x7f < local_8c) {
                iVar13 = (l * 4 + V0 + 1) * iVar7 + iVar12 / 8;
                this->mask[iVar13] =
                     this->mask[iVar13] | (byte)(1 << ((byte)((long)iVar12 % 8) & 0x1f));
                local_8c = local_8c + -0xff;
              }
              if (local_8c < 1) {
                ii_1._2_2_ = (short)((local_8c * 3 + -8) / 0x10);
                *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) =
                     *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) + ii_1._2_2_;
                ii_1._0_2_ = (short)((local_8c * 7 + -8) / 0x10);
                *(short *)((long)pvVar10 + (long)iVar12 * 2) =
                     *(short *)((long)pvVar10 + (long)iVar12 * 2) + (short)ii_1;
                val_1 = (short)((long)(local_8c + -8) / 0x10);
                *(short *)((long)pvVar11 + (long)iVar12 * 2) = val_1;
              }
              else {
                ii_1._2_2_ = (short)((local_8c * 3 + 8) / 0x10);
                *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) =
                     *(short *)((long)pvVar11 + (long)(iVar12 + 2) * 2) + ii_1._2_2_;
                ii_1._0_2_ = (short)((local_8c * 7 + 8) / 0x10);
                *(short *)((long)pvVar10 + (long)iVar12 * 2) =
                     *(short *)((long)pvVar10 + (long)iVar12 * 2) + (short)ii_1;
                val_1 = (short)((long)(local_8c + 8) / 0x10);
                *(short *)((long)pvVar11 + (long)iVar12 * 2) = val_1;
              }
              *(short *)((long)pvVar11 + (long)(iVar12 + 1) * 2) =
                   *(short *)((long)pvVar11 + (long)(iVar12 + 1) * 2) +
                   (((local_8c - ii_1._2_2_) - (short)ii_1) - val_1);
            }
          }
        }
      }
      if (pvVar10 != (void *)0x0) {
        operator_delete__(pvVar10);
      }
      if (pvVar11 != (void *)0x0) {
        operator_delete__(pvVar11);
      }
      this_local._4_4_ = 0;
    }
    else if (bVar4) {
      if (bVar5) {
        iVar7 = (w + 7) / 8;
        puVar8 = (uchar *)operator_new__((long)(h * iVar7));
        this->mask = puVar8;
        for (k = 0; k < h * iVar7; k = k + 1) {
          this->mask[k] = '\0';
        }
        for (l = 0; l < h; l = l + 1) {
          for (k = 0; k < w; k = k + 1) {
            if (data[l * iVar6 + D * k + D + -1] != '\0') {
              iVar12 = l * iVar7 + k / 8;
              this->mask[iVar12] = this->mask[iVar12] | (byte)(1 << ((byte)((long)k % 8) & 0x1f));
            }
          }
        }
        this->mx = w;
        this->my = h;
        this_local._4_4_ = 0;
      }
      else {
        this->mask = (uchar *)0x0;
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_PostScript_Graphics_Driver::alpha_mask(const uchar * data, int w, int h, int D, int LD){

  mask = 0;
  if ((D/2)*2 != D){ //no mask info
    return 0;
  }
  int xx;
  int i,j, k, l;
  LD += w*D;
  int V255=0;
  int V0 =0;
  int V_=0;
  for (j=0;j<h;j++){
    for (i=0;i<w;i++)
      switch(data[j*LD+D*i+D-1]){
        case 255: V255 = 1; break;
        case 0: V0 = 1; break;
        default: V_= 1;
      }
    if (V_) break;
  };
  if (!V_){
    if (V0)
      if (V255){// not true alpha, only masking
        xx = (w+7)/8;
        mask = new uchar[h * xx];
        for (i=0;i<h * xx;i++) mask[i]=0;
        for (j=0;j<h;j++)
          for (i=0;i<w;i++)
            if (data[j*LD+D*i+D-1])
              mask[j*xx+i/8] |= 1 << (i % 8);
        mx = w;
        my = h; //mask imensions
        return 0;
      } else {
        mask=0;
        return 1; //everything masked
      }
    else
      return 0;
  }



  /////   Alpha dither, generating (4*w) * 4 mask area       /////
  /////         with Floyd-Steinberg error diffusion         /////

  mask = new uchar[((w+1)/2) * h * 4];

  for (i = 0; i<((w+1)/2) * h * 4; i++) mask[i] = 0; //cleaning



  mx= w*4;
  my=h*4; // mask dimensions

  xx = (w+1)/2;                //  mask line width in bytes

  short * errors1 = new short [w*4+2]; //  two rows of dither errors
  short * errors2 = new short [w*4+2]; //  two rows of dither errors

  for (i=0; i<w*4+2; i++) errors2[i] = 0; // cleaning,after first swap will become current
  for (i=0; i<w*4+2; i++) errors1[i] = 0; // cleaning,after first swap will become current

  short * current = errors1;
  short * next = errors2;
  short * swap;

  for (j=0; j<h; j++){
    for (l=0; l<4; ){           // generating 4 rows of mask lines for 1 RGB line
      int jj = j*4+l;

      /// mask row index
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1
      for (i=0; i<w; i++){
        for (k=0; k<4; k++){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;
          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){
            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          }else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii] +=  o1 = (error * 3 + 8)/16;
            current[ii+2] += o2 = (error * 7 + 8)/16;
            next[ii+2] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii] += o1 = (error * 3 - 8)/16;
            current[ii+2] += o2 = (error * 7 - 8)/16;
            next[ii+2] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;

      ////// backward

      jj = j*4+l;
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1

      for (i = w-1; i >= 0; i--){

        for (k=3; k>=0; k--){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;

          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){

            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          } else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii+2] +=  o1 = (error * 3 + 8)/16;
            current[ii] += o2 = (error * 7 + 8)/16;
            next[ii] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii+2] += o1 = (error * 3 - 8)/16;

            current[ii] += o2 = (error * 7 - 8)/16;
            next[ii] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;
    }
  }
  delete[] errors1;
  delete[] errors2;
  return 0;
}